

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImU32 *pIVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImGuiWindow *pIVar3;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 IVar4;
  ImVec2 p_min;
  ImVec2 p_min_00;
  ImVec2 IVar5;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImGuiContext *pIVar6;
  undefined8 text;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  ImU32 IVar10;
  ImGuiWindowTempData *pIVar11;
  byte bVar12;
  ImGuiID IVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  bool held;
  bool hovered;
  char log_suffix [3];
  char log_prefix [4];
  ImVec2 label_size;
  ImRect interact_bb;
  bool local_ee;
  bool local_ed;
  float local_ec;
  ImVec2 local_e8;
  ImRect local_e0;
  float local_d0;
  char local_cc [4];
  char *local_c8;
  char local_bc [4];
  undefined1 local_b8 [16];
  ImVec2 local_a0;
  float local_98;
  float fStack_94;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ImRect local_68;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar6 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->SkipItems != false) {
    return false;
  }
  if ((flags & 0x402U) == 0) {
    fVar17 = (pIVar3->DC).CurrLineTextBaseOffset;
    fVar16 = (pIVar6->Style).FramePadding.y;
    if (fVar16 <= fVar17) {
      fVar17 = fVar16;
    }
  }
  else {
    fVar17 = (pIVar6->Style).FramePadding.y;
  }
  local_b8 = ZEXT416((uint)fVar17);
  local_78 = ZEXT416((uint)(pIVar6->Style).FramePadding.x);
  if (label_end == (char *)0x0) {
    label_end = FindRenderedTextEnd(label,(char *)0x0);
  }
  local_c8 = label_end;
  local_a0 = CalcTextSize(label,label_end,false,-1.0);
  pIVar11 = (ImGuiWindowTempData *)&pIVar3->WorkRect;
  if (((uint)flags >> 0xc & 1) == 0) {
    pIVar11 = &pIVar3->DC;
  }
  fVar17 = (pIVar3->DC).CurrLineSize.y;
  local_68.Min.x = pIVar6->FontSize;
  fVar16 = (pIVar6->Style).FramePadding.y;
  fVar16 = fVar16 + fVar16 + local_68.Min.x;
  if (fVar16 <= fVar17) {
    fVar17 = fVar16;
  }
  fVar16 = (float)local_b8._0_4_ + (float)local_b8._0_4_ + local_a0.y;
  uVar15 = -(uint)(fVar16 <= fVar17);
  local_68.Min.y = (float)(uVar15 & (uint)fVar17 | ~uVar15 & (uint)fVar16);
  local_d0 = (pIVar11->CursorPos).x;
  local_e0.Min.y = (pIVar3->DC).CursorPos.y;
  local_e0.Max.x = (pIVar3->WorkRect).Max.x;
  local_e0.Max.y = local_68.Min.y + local_e0.Min.y;
  if ((flags & 2U) == 0) {
    fVar17 = 2.0;
  }
  else {
    fVar17 = (pIVar3->WindowPadding).x * 0.5;
    local_d0 = local_d0 - (float)(int)(fVar17 + -1.0);
    local_e0.Max.x = local_e0.Max.x + (float)(int)fVar17;
    fVar17 = 3.0;
  }
  local_98 = fVar17 * (float)local_78._0_4_ + local_68.Min.x;
  fVar17 = (pIVar3->DC).CurrLineTextBaseOffset;
  uVar15 = -(uint)(fVar17 <= (float)local_b8._0_4_);
  local_ec = (float)local_78._0_4_ + (float)local_78._0_4_;
  local_68.Min.x =
       (float)(-(uint)(0.0 < local_a0.x) & (uint)(local_ec + local_a0.x)) + local_68.Min.x;
  local_88 = ZEXT416((uint)local_98);
  local_98 = (pIVar3->DC).CursorPos.x + local_98;
  fStack_94 = (float)(~uVar15 & (uint)fVar17 | uVar15 & local_b8._0_4_) + local_e0.Min.y;
  uStack_90 = 0;
  local_e8.y = fStack_94;
  local_e8.x = local_98;
  local_48 = ZEXT416((uint)local_68.Min.x);
  local_e0.Min.x = local_d0;
  ItemSize(&local_68.Min,(float)local_b8._0_4_);
  local_68.Min.y = local_e0.Min.y;
  local_68.Min.x = local_e0.Min.x;
  local_68.Max.x = local_e0.Max.x;
  if ((flags & 0x1802U) == 0) {
    fVar17 = (pIVar6->Style).ItemSpacing.x;
    local_68.Max.x = fVar17 + fVar17 + (float)local_48._0_4_ + local_d0;
  }
  local_68.Max.y = local_e0.Max.y;
  bVar7 = TreeNodeBehaviorIsOpen(id,flags);
  if (((bVar7) && ((flags & 0x2008U) == 0x2000)) && (pIVar6->NavIdIsAlive == false)) {
    pIVar1 = &(pIVar3->DC).TreeJumpToParentOnPopMask;
    *pIVar1 = *pIVar1 | 1 << ((byte)(pIVar3->DC).TreeDepth & 0x1f);
  }
  bVar8 = ItemAdd(&local_68,id,(ImRect *)0x0);
  pIVar2 = &(pIVar3->DC).LastItemStatusFlags;
  *(byte *)pIVar2 = (byte)*pIVar2 | 2;
  IVar4.y = local_e0.Min.y;
  IVar4.x = local_e0.Min.x;
  IVar5.y = local_e0.Max.y;
  IVar5.x = local_e0.Max.x;
  (pIVar3->DC).LastItemDisplayRect.Min = IVar4;
  (pIVar3->DC).LastItemDisplayRect.Max = IVar5;
  if (!bVar8) {
    if (!bVar7 || (char)((flags & 8U) >> 3) != '\0') {
      return bVar7;
    }
    TreePushOverrideID(id);
    return true;
  }
  local_b8._0_8_ = label;
  uVar15 = 4;
  if ((flags & 0x40U) != 0) {
    uVar15 = (uint)flags >> 5 & 4 | 0x20;
  }
  uVar14 = uVar15 + 0x40;
  if (((uint)flags >> 8 & 1) != 0) {
    uVar14 = uVar15;
  }
  uVar14 = uVar14 + (flags & 4U) * 0x40;
  fVar17 = (pIVar6->Style).TouchExtraPadding.x;
  fVar16 = (local_98 - (float)local_88._0_4_) - fVar17;
  local_ec = local_ec + pIVar6->FontSize + (local_98 - (float)local_88._0_4_) + fVar17;
  _local_98 = CONCAT44(fStack_94,fVar16);
  if (((pIVar3 != pIVar6->HoveredWindow) || (fVar17 = (pIVar6->IO).MousePos.x, fVar17 < fVar16)) ||
     (local_ec <= fVar17)) {
    uVar14 = uVar14 | 0x1000;
  }
  bVar8 = ButtonBehavior(&local_68,id,&local_ed,&local_ee,uVar14);
  if (((uint)flags >> 8 & 1) != 0) goto LAB_0020bae2;
  if (bVar8) {
    if (((flags & 0xc0U) == 0) || (pIVar6->NavActivateId == id)) {
      bVar9 = 1;
    }
    else {
      bVar9 = 0;
    }
    if ((char)flags < '\0') {
      fVar17 = (pIVar6->IO).MousePos.x;
      bVar12 = 0;
      if ((local_98 <= fVar17) && (bVar12 = 0, fVar17 < local_ec)) {
        bVar12 = pIVar6->NavDisableMouseHover ^ 1;
      }
      bVar9 = bVar9 | bVar12;
    }
    bVar12 = bVar9;
    if (((flags & 0x40U) != 0) && (bVar12 = 1, (pIVar6->IO).MouseDoubleClicked[0] == false)) {
      bVar12 = bVar9;
    }
    bVar9 = 0;
    if (pIVar6->DragDropActive == false) {
      bVar9 = bVar12;
    }
    if (!bVar7) {
      bVar9 = bVar12;
    }
  }
  else {
    bVar9 = 0;
  }
  IVar13 = pIVar6->NavId;
  if (IVar13 == id) {
    if ((pIVar6->NavMoveRequest == true) && (bVar7 && pIVar6->NavMoveDir == 0)) {
      NavMoveRequestCancel();
      IVar13 = pIVar6->NavId;
      bVar9 = 1;
      goto LAB_0020ba9b;
    }
LAB_0020ba9f:
    if ((pIVar6->NavMoveRequest != true) || (pIVar6->NavMoveDir != 1 || bVar7)) goto LAB_0020bab9;
    NavMoveRequestCancel();
  }
  else {
LAB_0020ba9b:
    if (IVar13 == id) goto LAB_0020ba9f;
LAB_0020bab9:
    if (bVar9 == 0) goto LAB_0020bae2;
  }
  bVar7 = !bVar7;
  ImGuiStorage::SetInt((pIVar3->DC).StateStorage,id,(uint)bVar7);
  pIVar2 = &(pIVar3->DC).LastItemStatusFlags;
  *(byte *)pIVar2 = (byte)*pIVar2 | 0x10;
LAB_0020bae2:
  if ((flags & 4U) != 0) {
    SetItemAllowOverlap();
  }
  fVar17 = (float)GetColorU32(0,1.0);
  if ((flags & 2U) == 0) {
    if (((flags & 1U) == 0 & (local_ed ^ 1U)) == 0) {
      uVar15 = 0x1a;
      if ((local_ee & local_ed) == 0) {
        uVar15 = local_ed | 0x18;
      }
      local_ec = fVar17;
      IVar10 = GetColorU32(uVar15,1.0);
      p_min.y = local_e0.Min.y;
      p_min.x = local_e0.Min.x;
      p_max.y = local_e0.Max.y;
      p_max.x = local_e0.Max.x;
      RenderFrame(p_min,p_max,IVar10,false,0.0);
      RenderNavHighlight(&local_e0,id,2);
      fVar17 = local_ec;
    }
    text = local_b8._0_8_;
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        pos_02.y = pIVar6->FontSize * 0.15 + local_e8.y;
        pos_02.x = (float)local_78._0_4_ + (local_e8.x - (float)local_88._0_4_);
        RenderArrow(pIVar3->DrawList,pos_02,(ImU32)fVar17,(uint)bVar7 * 2 + 1,0.7);
      }
    }
    else {
      pos_01.y = pIVar6->FontSize * 0.5 + local_e8.y;
      pos_01.x = -(float)local_88._0_4_ * 0.5 + local_e8.x;
      RenderBullet(pIVar3->DrawList,pos_01,(ImU32)fVar17);
    }
    if (pIVar6->LogEnabled == true) {
      LogRenderedText(&local_e8,">",(char *)0x0);
    }
    RenderText(local_e8,(char *)text,local_c8,false);
  }
  else {
    uVar14 = (local_ee ^ 1U) & local_ed | 0x18;
    uVar15 = 0x1a;
    if ((local_ed & 1U) == 0) {
      uVar15 = uVar14;
    }
    if (local_ee == false) {
      uVar15 = uVar14;
    }
    local_ec = fVar17;
    IVar10 = GetColorU32(uVar15,1.0);
    p_min_00.y = local_e0.Min.y;
    p_min_00.x = local_e0.Min.x;
    p_max_00.y = local_e0.Max.y;
    p_max_00.x = local_e0.Max.x;
    RenderFrame(p_min_00,p_max_00,IVar10,true,(pIVar6->Style).FrameRounding);
    RenderNavHighlight(&local_e0,id,2);
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        pos_00.y = local_e8.y;
        pos_00.x = (float)local_78._0_4_ + (local_e8.x - (float)local_88._0_4_);
        RenderArrow(pIVar3->DrawList,pos_00,(ImU32)local_ec,bVar7 + 1 + (uint)bVar7,1.0);
      }
      else {
        local_e8.x = local_e8.x - (float)local_88._0_4_;
      }
    }
    else {
      pos.y = pIVar6->FontSize * 0.5 + local_e8.y;
      pos.x = -(float)local_88._0_4_ * 0.6 + local_e8.x;
      RenderBullet(pIVar3->DrawList,pos,(ImU32)local_ec);
    }
    if (((uint)flags >> 0x14 & 1) != 0) {
      local_e0.Max.x = local_e0.Max.x - (pIVar6->FontSize + (pIVar6->Style).FramePadding.x);
    }
    if (pIVar6->LogEnabled == true) {
      builtin_strncpy(local_bc,"\n##",4);
      local_cc[2] = 0;
      local_cc[0] = '#';
      local_cc[1] = '#';
      LogRenderedText(&local_e8,local_bc,local_bc + 3);
      local_50.x = 0.0;
      local_50.y = 0.0;
      RenderTextClipped(&local_e8,&local_e0.Max,(char *)local_b8._0_8_,local_c8,&local_a0,&local_50,
                        (ImRect *)0x0);
      LogRenderedText(&local_e8,local_cc,local_cc + 2);
    }
    else {
      local_50.x = 0.0;
      local_50.y = 0.0;
      RenderTextClipped(&local_e8,&local_e0.Max,(char *)local_b8._0_8_,local_c8,&local_a0,&local_50,
                        (ImRect *)0x0);
    }
  }
  if (bVar7 == true && (char)((flags & 8U) >> 3) == '\0') {
    TreePushOverrideID(id);
  }
  return bVar7;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}